

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::computeTexCoordVecs<3>
               (vector<float,_std::allocator<float>_> *texCoords,Vector<float,_3> (*dst) [4])

{
  pointer pfVar1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  
  pfVar1 = (texCoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      ((Vector<float,_3> *)(*dst)[0].m_data)->m_data[lVar3] = pfVar1[lVar3];
    }
    pfVar1 = pfVar1 + 3;
    dst = (Vector<float,_3> (*) [4])((long)dst + 0xc);
  }
  return;
}

Assistant:

static inline void computeTexCoordVecs (const vector<float>& texCoords, tcu::Vector<float, N> (&dst)[4])
{
	DE_ASSERT((int)texCoords.size() == 4*N);
	for (int i = 0; i < 4; i++)
	for (int j = 0; j < N; j++)
		dst[i][j] = texCoords[i*N + j];
}